

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O2

void hide_shlib_symbols(GlobalVars *gv)

{
  Symbol *pSVar1;
  int i;
  long lVar2;
  Symbol **ppSVar3;
  Symbol **ppSVar4;
  
  for (lVar2 = 0; lVar2 != 0x10000; lVar2 = lVar2 + 1) {
    ppSVar4 = gv->symbols + lVar2;
    while (ppSVar3 = ppSVar4, pSVar1 = *ppSVar3, pSVar1 != (Symbol *)0x0) {
      ppSVar4 = &pSVar1->glob_chain;
      if ((pSVar1->flags & 0x12) == 0x10) {
        *ppSVar3 = *ppSVar4;
        *ppSVar4 = (Symbol *)0x0;
        ppSVar4 = ppSVar3;
      }
    }
  }
  return;
}

Assistant:

void hide_shlib_symbols(struct GlobalVars *gv)
/* scan for all unreferenced SYMF_SHLIB symbols in the global symbol list
   and remove them - they have to be invisible for the file we create */
{
  int i;

  for (i=0; i<SYMHTABSIZE; i++) {
    struct Symbol *sym;
    struct Symbol **chain = &gv->symbols[i];

    while (sym = *chain) {
      if ((sym->flags & SYMF_SHLIB) && !(sym->flags & SYMF_REFERENCED)) {
        /* remove from global symbol list */
        *chain = sym->glob_chain;
        sym->glob_chain = NULL;
      }
      else
        chain = &sym->glob_chain;
    }        
  }
}